

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
               (int *keys,int end,
               Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *compare,int start,bool type)

{
  type_conflict5 tVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined7 in_register_00000081;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int local_e0;
  uint local_dc;
  long local_d8;
  long local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  local_dc = (uint)CONCAT71(in_register_00000081,type);
  uVar7 = (ulong)(uint)start;
  if (end <= start + 1) {
    return;
  }
  uVar9 = (ulong)(end - 1);
LAB_004360c2:
  iVar4 = (int)uVar9;
  iVar5 = (int)uVar7;
  uVar2 = iVar4 - iVar5;
  if ((int)uVar2 < 0x19) {
    if ((int)uVar2 < 1) {
      return;
    }
    SPxShellsort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
              (keys,iVar4,compare,iVar5);
    return;
  }
  local_c0 = (long)(int)((uVar2 >> 1) + iVar5);
  iVar6 = keys[local_c0];
  local_d0 = (long)iVar4;
  local_d8 = (long)iVar5;
  uVar3 = uVar7 & 0xffffffff;
  uVar8 = uVar9 & 0xffffffff;
  local_c8 = uVar9;
  local_b8 = uVar7;
  do {
    uVar7 = (ulong)(int)uVar3;
    if ((local_dc & 1) == 0) {
      uVar9 = (ulong)(int)uVar8;
      for (; (long)uVar7 < local_d0; uVar7 = uVar7 + 1) {
        Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator()(&local_b0,compare,keys[uVar7],iVar6);
        local_e0 = 0;
        tVar1 = boost::multiprecision::operator<=(&local_b0,&local_e0);
        if (!tVar1) break;
      }
      do {
        if ((long)uVar9 <= local_d8) goto LAB_004361b0;
        Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator()(&local_b0,compare,keys[uVar9],iVar6);
        local_e0 = 0;
        tVar1 = boost::multiprecision::operator>(&local_b0,&local_e0);
        if (!tVar1) goto LAB_004361b0;
        uVar9 = uVar9 - 1;
      } while( true );
    }
    for (; (long)uVar7 < local_d0; uVar7 = uVar7 + 1) {
      Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator()(&local_b0,compare,keys[uVar7],iVar6);
      local_e0 = 0;
      tVar1 = boost::multiprecision::operator<(&local_b0,&local_e0);
      if (!tVar1) break;
    }
    for (uVar9 = (ulong)(int)uVar8; local_d8 < (long)uVar9; uVar9 = uVar9 - 1) {
      Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator()(&local_b0,compare,keys[uVar9],iVar6);
      local_e0 = 0;
      tVar1 = boost::multiprecision::operator>=(&local_b0,&local_e0);
      if (!tVar1) break;
    }
LAB_004361b0:
    iVar5 = (int)uVar7;
    iVar4 = (int)uVar9;
    if (iVar4 <= iVar5) break;
    iVar10 = keys[iVar5];
    keys[iVar5] = keys[iVar4];
    keys[iVar4] = iVar10;
    uVar3 = (ulong)(iVar5 + 1);
    uVar8 = (ulong)(iVar4 - 1);
  } while( true );
  if ((local_dc & 1) == 0) {
    for (uVar9 = (ulong)iVar4; local_d8 < (long)uVar9; uVar9 = uVar9 - 1) {
      Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator()(&local_b0,compare,iVar6,keys[uVar9]);
      local_e0 = 0;
      tVar1 = boost::multiprecision::operator<=(&local_b0,&local_e0);
      if (!tVar1) break;
    }
    if ((int)local_c8 == (int)uVar9) {
      iVar5 = keys[local_d0];
      keys[local_d0] = keys[local_c0];
      keys[local_c0] = iVar5;
      uVar9 = (ulong)((int)local_c8 - 1);
    }
  }
  else {
    for (uVar7 = (ulong)iVar5; (long)uVar7 < local_d0; uVar7 = uVar7 + 1) {
      Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator()(&local_b0,compare,iVar6,keys[uVar7]);
      local_e0 = 0;
      tVar1 = boost::multiprecision::operator>=(&local_b0,&local_e0);
      if (!tVar1) break;
    }
    if ((int)local_b8 == (int)uVar7) {
      iVar5 = keys[local_d8];
      keys[local_d8] = keys[local_c0];
      keys[local_c0] = iVar5;
      uVar7 = (ulong)((int)local_b8 + 1);
    }
  }
  iVar5 = (int)uVar9;
  iVar4 = (int)local_b8;
  iVar10 = (int)local_c8;
  iVar6 = (int)uVar7;
  if (iVar10 - iVar6 < iVar5 - iVar4) {
    uVar7 = local_b8 & 0xffffffff;
    uVar9 = uVar9 & 0xffffffff;
    iVar5 = iVar10;
    iVar4 = iVar6;
    if (iVar10 <= iVar6) goto LAB_00436320;
  }
  else {
    uVar9 = local_c8;
    if (iVar5 <= iVar4) goto LAB_00436320;
  }
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (keys,iVar5 + 1,compare,iVar4,(bool)(~(byte)local_dc & 1));
LAB_00436320:
  local_dc = local_dc ^ 1;
  goto LAB_004360c2;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}